

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O3

int __thiscall Fl_Slider::scrollvalue(Fl_Slider *this,int pos,int size,int first,int total)

{
  float fVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  (this->super_Fl_Valuator).A = 1.0;
  (this->super_Fl_Valuator).B = 1;
  iVar2 = (size + pos) - first;
  if (size + pos <= total + first) {
    iVar2 = total;
  }
  if (size < iVar2) {
    dVar5 = (double)size / (double)iVar2;
  }
  else {
    dVar5 = 1.0;
  }
  dVar4 = 0.0;
  if (0.0 <= dVar5) {
    dVar4 = dVar5;
  }
  dVar5 = 1.0;
  if (dVar4 <= 1.0) {
    dVar5 = dVar4;
  }
  fVar1 = *(float *)&(this->super_Fl_Valuator).field_0xa4;
  fVar3 = (float)dVar5;
  if ((fVar1 != fVar3) || (NAN(fVar1) || NAN(fVar3))) {
    *(float *)&(this->super_Fl_Valuator).field_0xa4 = fVar3;
    Fl_Widget::damage((Fl_Widget *)this,'\x02');
  }
  dVar4 = (double)first;
  dVar6 = (double)((first - size) + iVar2);
  dVar5 = (this->super_Fl_Valuator).min;
  if ((dVar5 == dVar4) && (!NAN(dVar5) && !NAN(dVar4))) {
    dVar5 = (this->super_Fl_Valuator).max;
    if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) goto LAB_001c9980;
  }
  (this->super_Fl_Valuator).min = dVar4;
  (this->super_Fl_Valuator).max = dVar6;
  Fl_Widget::damage((Fl_Widget *)this,'\x02');
LAB_001c9980:
  iVar2 = Fl_Valuator::value(&this->super_Fl_Valuator,(double)pos);
  return iVar2;
}

Assistant:

int Fl_Slider::scrollvalue(int pos, int size, int first, int total) {
  step(1, 1);
  if (pos+size > first+total) total = pos+size-first;
  slider_size(size >= total ? 1.0 : double(size)/double(total));
  bounds(first, total-size+first);
  return value(pos);
}